

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int remove_duplicates(int16_t *centroids,int num_centroids)

{
  int in_ESI;
  void *in_RDI;
  int i;
  int num_unique;
  int local_14;
  int local_10;
  
  qsort(in_RDI,(long)in_ESI,2,int16_comparer);
  local_10 = 1;
  for (local_14 = 1; local_14 < in_ESI; local_14 = local_14 + 1) {
    if (*(short *)((long)in_RDI + (long)local_14 * 2) !=
        *(short *)((long)in_RDI + (long)(local_14 + -1) * 2)) {
      *(undefined2 *)((long)in_RDI + (long)local_10 * 2) =
           *(undefined2 *)((long)in_RDI + (long)local_14 * 2);
      local_10 = local_10 + 1;
    }
  }
  return local_10;
}

Assistant:

static int remove_duplicates(int16_t *centroids, int num_centroids) {
  int num_unique;  // number of unique centroids
  int i;
  qsort(centroids, num_centroids, sizeof(*centroids), int16_comparer);
  // Remove duplicates.
  num_unique = 1;
  for (i = 1; i < num_centroids; ++i) {
    if (centroids[i] != centroids[i - 1]) {  // found a new unique centroid
      centroids[num_unique++] = centroids[i];
    }
  }
  return num_unique;
}